

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O3

bool slang::syntax::SyntaxFacts::isAllowedInGenerate(SyntaxKind kind)

{
  bool bVar1;
  
  if ((kind == DefParam) || (kind == PrimitiveInstantiation)) {
    return true;
  }
  if ((int)kind < 0xcf) {
    if (((kind - BindDirective < 0x38) &&
        ((0x80004000400801U >> ((ulong)(kind - BindDirective) & 0x3f) & 1) != 0)) ||
       (kind - AlwaysBlock < 4)) {
      return true;
    }
  }
  else {
    if ((kind - FinalBlock < 0x2d) &&
       ((0x100082104001U >> ((ulong)(kind - FinalBlock) & 0x3f) & 1) != 0)) {
      return true;
    }
    if (kind == LoopGenerate) {
      return true;
    }
    if (kind == NetAlias) {
      return true;
    }
  }
  bVar1 = isModuleCommonDecl(kind);
  return bVar1;
}

Assistant:

bool SyntaxFacts::isAllowedInGenerate(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::DefParam:
        case SyntaxKind::PrimitiveInstantiation:
            return true;
        default:
            return isModuleCommonItem(kind);
    }
}